

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O3

void __thiscall NoiseSource::proceedToNextState(NoiseSource *this)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  
  (this->super_StochasticProcess).stochNextStateIsPrepared = false;
  uVar1 = this->nNoises;
  if (0 < (int)uVar1) {
    lVar3 = 0;
    do {
      if (this->aNoises[lVar3] != (Noise *)0x0) {
        if ((int)uVar1 < 1) {
          dVar4 = 0.0;
        }
        else {
          dVar4 = 0.0;
          uVar2 = 0;
          do {
            dVar4 = dVar4 + this->aA[lVar3][uVar2] * this->aOmega[uVar2];
            uVar2 = uVar2 + 1;
          } while (uVar1 != uVar2);
        }
        (*(this->aNoises[lVar3]->super_StochasticVariable).super_StochasticProcess.super_Parametric.
          _vptr_Parametric[0xf])(dVar4);
        uVar1 = this->nNoises;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)uVar1);
  }
  (this->super_StochasticProcess).stochNextStateIsPrepared = false;
  return;
}

Assistant:

void NoiseSource::proceedToNextState()
{
	stochNextStateIsPrepared = false;
	for(int i=0; i<nNoises; ++i) {
		if(aNoises[i]) {
			double omega = 0.0;
			
			// sum up next value
			for(int n=0; n<nNoises; ++n)
				omega += aA[i][n] * aOmega[n];
			
			// notify noise process
			aNoises[i]->setNext(omega);
		}
	}
	stochNextStateIsPrepared = false;
}